

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O1

void mk_sched_worker_free(mk_server *server)

{
  long *plVar1;
  pthread_t pVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  mk_server *pmVar7;
  
  plVar1 = (long *)server->sched_ctx;
  pthread_mutex_lock((pthread_mutex_t *)&mutex_worker_exit);
  mk_plugin_exit_worker();
  pmVar7 = server;
  mk_vhost_fdt_worker_exit(server);
  cVar6 = (char)pmVar7;
  mk_cache_worker_exit();
  pVar2 = pthread_self();
  lVar5 = (long)server->workers;
  if (0 < lVar5) {
    lVar4 = *plVar1;
    do {
      if (*(pthread_t *)(lVar4 + 0x38) == pVar2) goto LAB_00109437;
      lVar4 = lVar4 + 0xa0;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar4 = 0;
LAB_00109437:
    if (lVar4 != 0) {
      pvVar3 = pthread_getspecific(mk_tls_sched_cs);
      free(pvVar3);
      pvVar3 = pthread_getspecific(mk_tls_sched_cs_incomplete);
      free(pvVar3);
      pvVar3 = pthread_getspecific(mk_tls_sched_worker_notif);
      free(pvVar3);
      pthread_mutex_unlock((pthread_mutex_t *)&mutex_worker_exit);
      return;
    }
  }
  mk_sched_worker_free_cold_1();
  if (cVar6 == '\x01') {
    return;
  }
  return;
}

Assistant:

void mk_sched_worker_free(struct mk_server *server)
{
    int i;
    pthread_t tid;
    struct mk_sched_ctx *ctx = server->sched_ctx;
    struct mk_sched_worker *worker = NULL;

    pthread_mutex_lock(&mutex_worker_exit);

    /*
     * Fix Me: needs to implement API to make plugins release
     * their resources first at WORKER LEVEL
     */

    /* External */
    mk_plugin_exit_worker();
    mk_vhost_fdt_worker_exit(server);
    mk_cache_worker_exit();

    /* Scheduler stuff */
    tid = pthread_self();
    for (i = 0; i < server->workers; i++) {
        worker = &ctx->workers[i];
        if (worker->tid == tid) {
            break;
        }
        worker = NULL;
    }

    mk_bug(!worker);

    /* FIXME!: there is nothing done here with the worker context */

    /* Free master array (av queue & busy queue) */
    mk_mem_free(MK_TLS_GET(mk_tls_sched_cs));
    mk_mem_free(MK_TLS_GET(mk_tls_sched_cs_incomplete));
    mk_mem_free(MK_TLS_GET(mk_tls_sched_worker_notif));
    pthread_mutex_unlock(&mutex_worker_exit);
}